

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::util::anon_unknown_0::ConvertDescriptorToTypeTest_TestJsonName_Test::TestBody
          (ConvertDescriptorToTypeTest_TestJsonName_Test *this)

{
  bool bVar1;
  Descriptor *pDVar2;
  Field *pFVar3;
  Descriptor *pDVar4;
  string *rhs;
  char *message;
  Descriptor *in_R8;
  string_view url_prefix;
  string_view name;
  string_view url_prefix_00;
  string_view name_00;
  AssertHelper local_1a0;
  Message local_198;
  basic_string_view<char,_std::char_traits<char>_> local_190;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_1;
  size_t local_168;
  Type local_160;
  AssertHelper local_e0;
  Message local_d8 [3];
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  size_t local_98;
  undefined1 local_90 [8];
  Type type;
  ConvertDescriptorToTypeTest_TestJsonName_Test *this_local;
  
  type.field_0._104_8_ = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_,
             "type.googleapis.com");
  pDVar2 = proto2_unittest::TestAllTypes::GetDescriptor();
  url_prefix._M_str = (char *)pDVar2;
  url_prefix._M_len = local_98;
  ConvertDescriptorToType
            ((Type *)local_90,
             (util *)gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,url_prefix,in_R8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_c0,"optional_int32");
  name._M_str = (char *)pDVar2;
  name._M_len = (size_t)local_c0._M_str;
  pFVar3 = FindField((anon_unknown_0 *)local_90,(Type *)local_c0._M_len,name);
  pDVar2 = (Descriptor *)Field::json_name_abi_cxx11_(pFVar3);
  testing::internal::EqHelper::
  Compare<char[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_b0,"\"optionalInt32\"",
             "FindField(type, \"optional_int32\")->json_name()",(char (*) [14])"optionalInt32",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pDVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(local_d8);
    pDVar2 = (Descriptor *)testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x2db,(char *)pDVar2);
    testing::internal::AssertHelper::operator=(&local_e0,local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message(local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_1.message_,
             "type.googleapis.com");
  pDVar4 = proto3::TestCustomJsonName::GetDescriptor();
  url_prefix_00._M_str = (char *)pDVar4;
  url_prefix_00._M_len = local_168;
  ConvertDescriptorToType
            (&local_160,
             (util *)gtest_ar_1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,url_prefix_00,pDVar2);
  Type::operator=((Type *)local_90,&local_160);
  Type::~Type(&local_160);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_190,"value");
  name_00._M_str = (char *)pDVar4;
  name_00._M_len = (size_t)local_190._M_str;
  pFVar3 = FindField((anon_unknown_0 *)local_90,(Type *)local_190._M_len,name_00);
  rhs = Field::json_name_abi_cxx11_(pFVar3);
  testing::internal::EqHelper::
  Compare<char[7],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_180,"\"@value\"","FindField(type, \"value\")->json_name()",
             (char (*) [7])"@value",rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x2df,message);
    testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  Type::~Type((Type *)local_90);
  return;
}

Assistant:

TEST(ConvertDescriptorToTypeTest, TestJsonName) {
  Type type = ConvertDescriptorToType(
      kUrlPrefix, *proto2_unittest::TestAllTypes::GetDescriptor());
  EXPECT_EQ("optionalInt32", FindField(type, "optional_int32")->json_name());

  type = ConvertDescriptorToType(kUrlPrefix,
                                 *proto3::TestCustomJsonName::GetDescriptor());
  EXPECT_EQ("@value", FindField(type, "value")->json_name());
}